

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_midiplay.cpp
# Opt level: O0

bool __thiscall OPNMIDIplay::doYamahaSysEx(OPNMIDIplay *this,uint dev,uint8_t *data,size_t size)

{
  bool bVar1;
  uint value;
  uint address;
  uint model;
  bool devicematch;
  size_t size_local;
  uint8_t *data_local;
  uint dev_local;
  OPNMIDIplay *this_local;
  
  bVar1 = true;
  if (dev != 0x7f) {
    bVar1 = (dev & 0xf) == (uint)this->m_sysExDeviceId;
  }
  if ((size == 0) || (!bVar1)) {
    this_local._7_1_ = false;
  }
  else if ((((((*data & 0x7f) << 8 | dev & 0xf0) == 0x4c10) && (2 < size - 1)) &&
           (((data[1] & 0x7f) << 0x10 | (data[2] & 0x7f) << 8 | data[3] & 0x7f) == 0x7e)) &&
          (size == 5)) {
    if ((this->hooks).onDebugMessage != (DebugMessageHook)0x0) {
      (*(this->hooks).onDebugMessage)
                ((this->hooks).onDebugMessage_userData,"SysEx: Caught Yamaha XG System On: %02X",
                 (ulong)(data[4] & 0x7f));
    }
    this->m_synthMode = 2;
    realTime_ResetState(this);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool OPNMIDIplay::doYamahaSysEx(unsigned dev, const uint8_t *data, size_t size)
{
    bool devicematch = dev == 0x7F || (dev & 0x0F) == m_sysExDeviceId;
    if(size < 1 || !devicematch)
        return false;

    unsigned model = data[0] & 0x7F;
    ++data;
    --size;

    switch((model << 8) | (dev & 0xF0))
    {
    case (YamahaModel_XG << 8) | 0x10:  // parameter change
    {
        if(size < 3)
            break;

        unsigned address =
            (((unsigned)data[0] & 0x7F) << 16) |
            (((unsigned)data[1] & 0x7F) << 8)  |
            (((unsigned)data[2] & 0x7F));
        data += 3;
        size -= 3;

        switch(address)
        {
        case 0x00007E:  // XG System On
            if(size != 1)
                break;
            unsigned value = data[0] & 0x7F;
            ADL_UNUSED(value);//TODO: Hook this correctly!
            if(hooks.onDebugMessage)
                hooks.onDebugMessage(hooks.onDebugMessage_userData, "SysEx: Caught Yamaha XG System On: %02X", value);
            m_synthMode = Mode_XG;
            realTime_ResetState();
            return true;
        }

        break;
    }
    }

    return false;
}